

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_GetFromVersions::_Run(_Test_GetFromVersions *this)

{
  bool bVar1;
  allocator local_222;
  allocator local_221;
  undefined1 local_220 [16];
  string local_210;
  string local_1f0;
  Tester local_1d0;
  
  do {
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x261);
    std::__cxx11::string::string((string *)&local_1f0,"foo",&local_221);
    std::__cxx11::string::string((string *)&local_210,"v1",&local_222);
    DBTest::Put((DBTest *)local_220,(string *)this,&local_1f0);
    test::Tester::IsOk(&local_1d0,(Status *)local_220);
    Status::~Status((Status *)local_220);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    test::Tester::~Tester(&local_1d0);
    DBImpl::TEST_CompactMemTable((DBImpl *)(local_220 + 8));
    Status::~Status((Status *)(local_220 + 8));
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x263);
    std::__cxx11::string::string((string *)&local_210,"foo",(allocator *)local_220);
    DBTest::Get(&local_1f0,&this->super_DBTest,&local_210,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1d0,(char (*) [3])"v1",&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    test::Tester::~Tester(&local_1d0);
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, GetFromVersions) {
  do {
    ASSERT_OK(Put("foo", "v1"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v1", Get("foo"));
  } while (ChangeOptions());
}